

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dropt.c
# Opt level: O0

dropt_error get_and_print_dropt_error(dropt_context *context)

{
  FILE *__stream;
  uint uVar1;
  undefined8 uVar2;
  dropt_error error;
  dropt_context *context_local;
  
  uVar1 = dropt_get_error(context);
  __stream = _stderr;
  if (uVar1 != 0) {
    uVar2 = dropt_get_error_message(context);
    fprintf(__stream,"[%d] %s\n",(ulong)uVar1,uVar2);
    dropt_clear_error(context);
  }
  return uVar1;
}

Assistant:

static dropt_error
get_and_print_dropt_error(dropt_context* context)
{
    dropt_error error = dropt_get_error(context);
    if (error != dropt_error_none)
    {
        ftprintf(stderr, T("[%d] %s\n"),
                 error, dropt_get_error_message(context));
        dropt_clear_error(context);
    }
    return error;
}